

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

double __thiscall
QLocaleData::stringToDouble(QLocaleData *this,QStringView str,bool *ok,NumberOptions number_options)

{
  QVLAStorage<1UL,_1UL,_256LL> *__s;
  bool bVar1;
  long in_FS_OFFSET;
  double dVar2;
  QSimpleParsedNumber<double> QVar3;
  CharBuff local_150;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  memset(__s,0xaa,0x100);
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr = __s;
  bVar1 = numberToCLocale(this,str,number_options,DoubleScientificMode,&local_150);
  if (bVar1) {
    QVar3 = qt_asciiToDouble((char *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
                             local_150.super_QVLABase<char>.super_QVLABaseBase.s + -1,
                             TrailingJunkProhibited);
    dVar2 = QVar3.result;
    if (ok == (bool *)0x0) goto LAB_0030a991;
    bVar1 = 0 < QVar3.used;
  }
  else {
    dVar2 = 0.0;
    if (ok == (bool *)0x0) goto LAB_0030a991;
    bVar1 = false;
  }
  *ok = bVar1;
LAB_0030a991:
  if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr != __s)
  {
    QtPrivate::sizedFree
              (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
               local_150.super_QVLABase<char>.super_QVLABaseBase.a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

double QLocaleData::stringToDouble(QStringView str, bool *ok,
                                   QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, DoubleScientificMode, &buff)) {
        if (ok != nullptr)
            *ok = false;
        return 0.0;
    }
    auto r = qt_asciiToDouble(buff.constData(), buff.size() - 1);
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}